

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HistogramBasedDistribution.cpp
# Opt level: O2

void __thiscall
HistogramBasedDistribution::printWithGaussian
          (HistogramBasedDistribution *this,ostream *os,double mean,double stddev)

{
  int iVar1;
  ostream *poVar2;
  HistogramBasedDistribution *pHVar3;
  int from;
  pointer ppVar4;
  double dVar5;
  normal norm;
  
  boost::math::
  normal_distribution<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
  ::normal_distribution(&norm,mean,stddev);
  ppVar4 = (this->values).
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  from = -1;
  dVar5 = -1.0;
  do {
    if (ppVar4 != (this->values).
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
      iVar1 = ppVar4->first;
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)os,from);
      poVar2 = std::operator<<(poVar2,' ');
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,ppVar4->first + -1);
      std::operator<<(poVar2,' ');
      pHVar3 = (HistogramBasedDistribution *)
               std::ostream::_M_insert<double>(dVar5 * (double)(iVar1 - from));
      std::operator<<((ostream *)pHVar3,' ');
      dVar5 = normal_mass(pHVar3,from,ppVar4->first + -1,&norm);
      poVar2 = std::ostream::_M_insert<double>(dVar5);
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    from = ppVar4->first;
    dVar5 = ppVar4->second;
    ppVar4 = ppVar4 + 1;
  } while (ppVar4 != (this->values).
                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  iVar1 = this->max;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)os,from);
  poVar2 = std::operator<<(poVar2,' ');
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,this->max);
  std::operator<<(poVar2,' ');
  pHVar3 = (HistogramBasedDistribution *)
           std::ostream::_M_insert<double>(dVar5 * (double)((iVar1 - from) + 1));
  std::operator<<((ostream *)pHVar3,' ');
  dVar5 = normal_mass(pHVar3,from,this->max,&norm);
  poVar2 = std::ostream::_M_insert<double>(dVar5);
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void HistogramBasedDistribution::printWithGaussian(ostream& os, double mean, double stddev) const {
	boost::math::normal norm(mean, stddev);
	vector<HistogramBasedDistribution::value_t>::const_iterator cit = values.begin();
	int start = -1;
	double p = -1.0;
	while (true) {
		if (cit != values.begin()) {
			int length = cit->first - start;
			os << start << ' ' << (cit->first-1) << ' ' << (p*length) << ' ' << normal_mass(start,cit->first-1,norm) << endl;
		}
		start = cit->first;
		p = cit->second;
		++cit;
		if (cit == values.end()) {
			int length = max - start + 1;
			os << start << ' ' << max << ' ' << (p*length) << ' ' << normal_mass(start,max,norm) << endl;
			break;
		}
	}
}